

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos1,size_type n1,
          basic_string_view<char,_std::char_traits<char>_> other)

{
  uint uVar1;
  ulong uVar2;
  ulong __n;
  ulong uVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  
  uVar3 = other.size_;
  bVar4 = substr(this,pos1,n1);
  uVar2 = bVar4.size_;
  __n = uVar3;
  if (uVar2 < uVar3) {
    __n = uVar2;
  }
  if (__n == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = memcmp(bVar4.data_,other.data_,__n);
  }
  if ((uVar1 == 0) && (uVar1 = 0, uVar2 != uVar3)) {
    uVar1 = -(uint)(uVar2 < uVar3) | 1;
  }
  return uVar1;
}

Assistant:

nssv_constexpr int compare(size_type pos1, size_type n1, basic_string_view other) const  // (2)
		{
			return substr(pos1, n1).compare(other);
		}